

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

size_t * Catch::anon_unknown_26::findMax(size_t *i,size_t *j,size_t *k,size_t *l)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = *i;
  uVar2 = *j;
  uVar3 = *k;
  uVar4 = *l;
  if ((((uVar1 <= uVar3 || uVar1 <= uVar2) || uVar1 <= uVar4) &&
      (i = j, uVar2 <= uVar3 || uVar2 <= uVar4)) && (i = l, uVar4 < uVar3)) {
    i = k;
  }
  return i;
}

Assistant:

std::size_t&
findMax( std::size_t& i, std::size_t& j, std::size_t& k, std::size_t& l ) {
    if (i > j && i > k && i > l)
        return i;
    else if (j > k && j > l)
        return j;
    else if (k > l)
        return k;
    else
        return l;
}